

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastQueue.cpp
# Opt level: O2

void __thiscall FastQueue::FastQueue(FastQueue *this,uint32_t num_buckets,uint32_t pages_per_bucket)

{
  Bucket *in_RAX;
  long lVar1;
  uint8_t *puVar2;
  Bucket *this_00;
  ulong uVar3;
  ulong uVar4;
  uint32_t bucket_size;
  bool bVar5;
  Bucket *local_38;
  
  uVar4 = (ulong)num_buckets;
  this->num_buckets = num_buckets;
  this->pages_per_bucket = pages_per_bucket;
  (this->buckets).super__Vector_base<Bucket_*,_std::allocator<Bucket_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->buckets).super__Vector_base<Bucket_*,_std::allocator<Bucket_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->buckets).super__Vector_base<Bucket_*,_std::allocator<Bucket_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_38 = in_RAX;
  lVar1 = sysconf(0x1e);
  bucket_size = (int)lVar1 * pages_per_bucket;
  uVar3 = 0;
  puVar2 = (uint8_t *)mmap((void *)0x0,(ulong)(bucket_size * num_buckets),3,0x22,-1,0);
  this->base = puVar2;
  if (puVar2 != (uint8_t *)0xffffffffffffffff) {
    this->head = 0;
    this->tail = 0;
    pthread_mutex_init((pthread_mutex_t *)&this->global_mutex,(pthread_mutexattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&this->full_cond,(pthread_condattr_t *)0x0);
    pthread_cond_init((pthread_cond_t *)&this->empty_cond,(pthread_condattr_t *)0x0);
    while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
      this_00 = (Bucket *)operator_new(0x58);
      Bucket::Bucket(this_00,this->base + uVar3,bucket_size);
      local_38 = this_00;
      std::vector<Bucket*,std::allocator<Bucket*>>::emplace_back<Bucket*>
                ((vector<Bucket*,std::allocator<Bucket*>> *)&this->buckets,&local_38);
      uVar3 = (ulong)((int)uVar3 + bucket_size);
    }
    return;
  }
  perror("mmap error");
  exit(0);
}

Assistant:

FastQueue::FastQueue(uint32_t num_buckets, uint32_t pages_per_bucket):num_buckets(num_buckets), pages_per_bucket(pages_per_bucket), distance(distance){
    
    

    // get the page_size of current system
    uint32_t huge_page_size = sysconf(_SC_PAGESIZE);
    
    if ((base = (uint8_t*) mmap(NULL, pages_per_bucket * num_buckets * huge_page_size,
                                      PROT_WRITE | PROT_READ,
                                      MAP_PRIVATE| MAP_ANONYMOUS, -1, 0)) == MAP_FAILED) {
                perror("mmap error");
                exit(0);
    }
    

    head = tail = 0;
    pthread_mutex_init(&global_mutex, NULL);
    pthread_cond_init(&full_cond, NULL);
    pthread_cond_init(&empty_cond, NULL);

    for(int i = 0; i < num_buckets; ++i){
         buckets.push_back(new Bucket(base + i * pages_per_bucket * huge_page_size, pages_per_bucket * huge_page_size));
         //printf("%d\n", base + i * pages_per_bucket * huge_page_size);
    }
}